

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlinux.c
# Opt level: O2

void * Pt_CallbackProc(void *p)

{
  code *pcVar1;
  __uid_t _Var2;
  PtTimestamp PVar3;
  int iVar4;
  int iVar5;
  timeval timeout;
  
  _Var2 = geteuid();
  if (_Var2 == 0) {
    setpriority(PRIO_PROCESS,0,-0x14);
  }
  iVar4 = 1;
  while (pt_callback_proc_id == *p) {
    iVar5 = *(int *)((long)p + 4);
    PVar3 = Pt_Time();
    iVar5 = iVar4 * iVar5 - PVar3;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    timeout.tv_sec = 0;
    timeout.tv_usec = (__suseconds_t)(uint)(iVar5 * 1000);
    select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeout);
    pcVar1 = *(code **)((long)p + 8);
    Pt_Time();
    (*pcVar1)();
    iVar4 = iVar4 + 1;
  }
  return (void *)0x0;
}

Assistant:

static void *Pt_CallbackProc(void *p)
{
    pt_callback_parameters *parameters = (pt_callback_parameters *) p;
    int mytime = 1;
    /* to kill a process, just increment the pt_callback_proc_id */
    /* printf("pt_callback_proc_id %d, id %d\n", pt_callback_proc_id,
           parameters->id); */
    if (geteuid() == 0) setpriority(PRIO_PROCESS, 0, -20);
    while (pt_callback_proc_id == parameters->id) {
        /* wait for a multiple of resolution ms */
        struct timeval timeout;
        int delay = mytime++ * parameters->resolution - Pt_Time();
        if (delay < 0) delay = 0;
        timeout.tv_sec = 0;
        timeout.tv_usec = delay * 1000;
        select(0, NULL, NULL, NULL, &timeout);
        (*(parameters->callback))(Pt_Time(), parameters->userData);
    }
    /* printf("Pt_CallbackProc exiting\n"); */
    // free(parameters);
    return NULL;
}